

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

void __thiscall TCMallocGuard::~TCMallocGuard(TCMallocGuard *this)

{
  int iVar1;
  int local_1c;
  char *pcStack_18;
  int level;
  char *env;
  TCMallocGuard *this_local;
  
  tcmallocguard_refcount = tcmallocguard_refcount + -1;
  if (tcmallocguard_refcount == 0) {
    pcStack_18 = (char *)0x0;
    iVar1 = RunningOnValgrind();
    if (iVar1 == 0) {
      pcStack_18 = getenv("MALLOCSTATS");
    }
    if (pcStack_18 != (char *)0x0) {
      local_1c = atoi(pcStack_18);
      if (local_1c < 1) {
        local_1c = 1;
      }
      PrintStats(local_1c);
    }
  }
  return;
}

Assistant:

TCMallocGuard::~TCMallocGuard() {
  if (--tcmallocguard_refcount == 0) {
    const char* env = nullptr;
    if (!RunningOnValgrind()) {
      // Valgrind uses it's own malloc so we cannot do MALLOCSTATS
      env = getenv("MALLOCSTATS");
    }
    if (env != nullptr) {
      int level = atoi(env);
      if (level < 1) level = 1;
      PrintStats(level);
    }
  }
}